

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extractor.cpp
# Opt level: O0

void __thiscall Extractor::~Extractor(Extractor *this)

{
  void *in_RSI;
  Extractor *this_local;
  
  _free(this,in_RSI);
  std::__cxx11::string::~string((string *)&this->_file_name);
  std::vector<WaveFile_*,_std::allocator<WaveFile_*>_>::~vector
            (&this->super_vector<WaveFile_*,_std::allocator<WaveFile_*>_>);
  return;
}

Assistant:

Extractor::~Extractor()
{
	_free();
}